

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::MessageGenerator
          (MessageGenerator *this,string *root_classname,Descriptor *descriptor,Options *options)

{
  ExtensionGenerator *this_00;
  OneofGenerator *this_01;
  EnumGenerator *this_02;
  MessageGenerator *this_03;
  Descriptor *descriptor_00;
  Descriptor *pDVar1;
  int i;
  long lVar2;
  long lVar3;
  OneofGenerator *generator;
  vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
  *local_60;
  vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
  *local_58;
  vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
  *local_50;
  vector<google::protobuf::compiler::objectivec::ExtensionGenerator*,std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator*>>
  *local_48;
  string *local_40;
  Options *local_38;
  
  std::__cxx11::string::string((string *)this,(string *)root_classname);
  this->descriptor_ = descriptor;
  local_38 = options;
  FieldGeneratorMap::FieldGeneratorMap(&this->field_generators_,descriptor,options);
  local_40 = &this->class_name_;
  ClassName_abi_cxx11_(local_40,(objectivec *)this->descriptor_,descriptor_00);
  GetOptionalDeprecatedAttribute<google::protobuf::Descriptor>
            (&this->deprecated_attribute_,descriptor,*(FileDescriptor **)(descriptor + 0x10),false,
             true);
  local_48 = (vector<google::protobuf::compiler::objectivec::ExtensionGenerator*,std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator*>>
              *)&this->extension_generators_;
  local_58 = &this->enum_generators_;
  local_60 = &this->nested_message_generators_;
  local_50 = &this->oneof_generators_;
  (this->oneof_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->oneof_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nested_message_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->oneof_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nested_message_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nested_message_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar3 = 0;
  for (lVar2 = 0; pDVar1 = this->descriptor_, lVar2 < *(int *)(pDVar1 + 0x78); lVar2 = lVar2 + 1) {
    this_00 = (ExtensionGenerator *)operator_new(0x48);
    ExtensionGenerator::ExtensionGenerator
              (this_00,local_40,(FieldDescriptor *)(*(long *)(pDVar1 + 0x80) + lVar3));
    generator = (OneofGenerator *)this_00;
    std::
    vector<google::protobuf::compiler::objectivec::ExtensionGenerator*,std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator*>>
    ::emplace_back<google::protobuf::compiler::objectivec::ExtensionGenerator*>
              (local_48,(ExtensionGenerator **)&generator);
    lVar3 = lVar3 + 0xa8;
  }
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(pDVar1 + 0x38); lVar2 = lVar2 + 1) {
    this_01 = (OneofGenerator *)operator_new(0x38);
    OneofGenerator::OneofGenerator(this_01,(OneofDescriptor *)(*(long *)(pDVar1 + 0x40) + lVar3));
    generator = this_01;
    std::
    vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
    ::push_back(local_50,&generator);
    pDVar1 = this->descriptor_;
    lVar3 = lVar3 + 0x30;
  }
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(pDVar1 + 0x58); lVar2 = lVar2 + 1) {
    this_02 = (EnumGenerator *)operator_new(0x58);
    EnumGenerator::EnumGenerator(this_02,(EnumDescriptor *)(*(long *)(pDVar1 + 0x60) + lVar3));
    generator = (OneofGenerator *)this_02;
    std::
    vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
    ::push_back(local_58,(value_type *)&generator);
    pDVar1 = this->descriptor_;
    lVar3 = lVar3 + 0x38;
  }
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(pDVar1 + 0x48); lVar3 = lVar3 + 1) {
    this_03 = (MessageGenerator *)operator_new(0xe0);
    MessageGenerator(this_03,&this->root_classname_,(Descriptor *)(*(long *)(pDVar1 + 0x50) + lVar2)
                     ,local_38);
    generator = (OneofGenerator *)this_03;
    std::
    vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
    ::push_back(local_60,(value_type *)&generator);
    pDVar1 = this->descriptor_;
    lVar2 = lVar2 + 0xa8;
  }
  return;
}

Assistant:

MessageGenerator::MessageGenerator(const string& root_classname,
                                   const Descriptor* descriptor,
                                   const Options& options)
    : root_classname_(root_classname),
      descriptor_(descriptor),
      field_generators_(descriptor, options),
      class_name_(ClassName(descriptor_)),
      deprecated_attribute_(
          GetOptionalDeprecatedAttribute(descriptor, descriptor->file(), false, true)) {

  for (int i = 0; i < descriptor_->extension_count(); i++) {
    extension_generators_.push_back(
        new ExtensionGenerator(class_name_, descriptor_->extension(i)));
  }

  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    OneofGenerator* generator = new OneofGenerator(descriptor_->oneof_decl(i));
    oneof_generators_.push_back(generator);
  }

  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumGenerator* generator = new EnumGenerator(descriptor_->enum_type(i));
    enum_generators_.push_back(generator);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    MessageGenerator* generator =
        new MessageGenerator(root_classname_,
                             descriptor_->nested_type(i),
                             options);
    nested_message_generators_.push_back(generator);
  }
}